

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

void __thiscall ON_ClippingPlaneData::ON_ClippingPlaneData(ON_ClippingPlaneData *this)

{
  ON_ClippingPlaneData *this_local;
  
  this->m_sn = 0;
  this->m_depth = 0.0;
  ON_UuidList::ON_UuidList(&this->m_object_id_list,0);
  ON_SimpleArray<int>::ON_SimpleArray(&this->m_layer_list);
  this->m_layer_list_is_sorted = true;
  this->m_is_exclusion_list = true;
  return;
}

Assistant:

ON_ClippingPlaneData():m_object_id_list(0){}